

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

base_block_t *
base_block_alloc(tsdn_t *tsdn,base_t *base,extent_hooks_t *extent_hooks,uint ind,pszind_t *pind_last
                ,size_t *extent_sn_next,size_t size,size_t alignment)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  base_t *pbVar6;
  base_t *pbVar7;
  long in_RSI;
  int *in_R8;
  ulong in_stack_00000010;
  void *addr;
  base_block_t *block;
  size_t block_size;
  size_t next_block_size;
  pszind_t pind_next;
  size_t min_block_size;
  size_t gap_size;
  size_t header_size;
  size_t usize;
  pszind_t ind_2;
  pszind_t mod_1;
  size_t delta_inverse_mask_1;
  pszind_t lg_delta_1;
  pszind_t grp_1;
  pszind_t shift_1;
  pszind_t x_1;
  pszind_t ind_1;
  pszind_t mod;
  size_t delta_inverse_mask;
  pszind_t lg_delta;
  pszind_t grp;
  pszind_t shift;
  pszind_t x;
  size_t in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  base_t *base_00;
  int iVar8;
  int iVar9;
  size_t in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff40;
  int iVar10;
  base_block_t *local_68;
  int local_34;
  
  in_stack_00000010 = in_stack_00000010 + 0xf & 0xfffffffffffffff0;
  sVar5 = sz_psz2u(in_stack_ffffffffffffff28);
  pbVar6 = (base_t *)(sVar5 + 0x1fffff & 0xffffffffffe00000);
  uVar2 = *in_R8 + 1;
  uVar3 = lg_floor(0xdfffffffffffffff);
  if (uVar3 < 0xe) {
    iVar9 = 0;
  }
  else {
    iVar9 = uVar3 - 0xe;
  }
  if (uVar3 < 0xf) {
    iVar8 = 0xc;
  }
  else {
    iVar8 = uVar3 - 3;
  }
  if (uVar2 < iVar9 * 4 +
              ((uint)((-1L << ((byte)iVar8 & 0x3f) & 0x6fffffffffffffffU) >> ((byte)iVar8 & 0x3f)) &
              3)) {
    iVar4 = *in_R8 + 1;
  }
  else {
    iVar4 = *in_R8;
  }
  iVar10 = iVar4;
  sVar5 = sz_pind2sz(0);
  pbVar7 = (base_t *)(sVar5 + 0x1fffff & 0xffffffffffe00000);
  base_00 = pbVar7;
  if (pbVar7 < pbVar6) {
    base_00 = pbVar6;
  }
  pbVar6 = base_00;
  local_68 = (base_block_t *)
             base_map((tsdn_t *)CONCAT44(iVar10,in_stack_ffffffffffffff40),(extent_hooks_t *)pbVar7,
                      (uint)((ulong)base_00 >> 0x20),in_stack_ffffffffffffff28);
  if (local_68 == (base_block_t *)0x0) {
    local_68 = (base_block_t *)0x0;
  }
  else {
    _Var1 = metadata_thp_madvise();
    if (_Var1) {
      if (opt_metadata_thp == metadata_thp_always) {
        pages_huge((void *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8);
      }
      else if ((opt_metadata_thp == metadata_thp_auto) && (in_RSI != 0)) {
        malloc_mutex_lock((tsdn_t *)CONCAT44(uVar2,iVar9),(malloc_mutex_t *)CONCAT44(iVar8,iVar4));
        base_auto_thp_switch((tsdn_t *)CONCAT44(iVar8,iVar4),base_00);
        if ((*(byte *)(in_RSI + 0x80) & 1) != 0) {
          pages_huge((void *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffef8);
        }
        malloc_mutex_unlock((tsdn_t *)CONCAT44(iVar8,iVar4),(malloc_mutex_t *)base_00);
      }
    }
    if (pbVar6 < (base_t *)0x7000000000000001) {
      pbVar7 = pbVar6;
      uVar2 = lg_floor((long)pbVar6 * 2 - 1);
      if (uVar2 < 0xe) {
        in_stack_ffffffffffffff04 = 0;
      }
      else {
        in_stack_ffffffffffffff04 = uVar2 - 0xe;
      }
      if (uVar2 < 0xf) {
        in_stack_ffffffffffffff00 = 0xc;
      }
      else {
        in_stack_ffffffffffffff00 = uVar2 - 3;
      }
      local_34 = in_stack_ffffffffffffff04 * 4 +
                 ((uint)(((ulong)((long)&pbVar6[-1].n_thp + 7U) &
                         -1L << ((byte)in_stack_ffffffffffffff00 & 0x3f)) >>
                        ((byte)in_stack_ffffffffffffff00 & 0x3f)) & 3);
      pbVar6 = pbVar7;
    }
    else {
      local_34 = 199;
    }
    *in_R8 = local_34;
    local_68->size = (size_t)pbVar6;
    local_68->next = (base_block_t *)0x0;
    base_extent_init((size_t *)CONCAT44(iVar8,iVar4),(extent_t *)base_00,
                     (void *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffef8);
  }
  return local_68;
}

Assistant:

static base_block_t *
base_block_alloc(tsdn_t *tsdn, base_t *base, extent_hooks_t *extent_hooks,
    unsigned ind, pszind_t *pind_last, size_t *extent_sn_next, size_t size,
    size_t alignment) {
	alignment = ALIGNMENT_CEILING(alignment, QUANTUM);
	size_t usize = ALIGNMENT_CEILING(size, alignment);
	size_t header_size = sizeof(base_block_t);
	size_t gap_size = ALIGNMENT_CEILING(header_size, alignment) -
	    header_size;
	/*
	 * Create increasingly larger blocks in order to limit the total number
	 * of disjoint virtual memory ranges.  Choose the next size in the page
	 * size class series (skipping size classes that are not a multiple of
	 * HUGEPAGE), or a size large enough to satisfy the requested size and
	 * alignment, whichever is larger.
	 */
	size_t min_block_size = HUGEPAGE_CEILING(sz_psz2u(header_size + gap_size
	    + usize));
	pszind_t pind_next = (*pind_last + 1 < sz_psz2ind(SC_LARGE_MAXCLASS)) ?
	    *pind_last + 1 : *pind_last;
	size_t next_block_size = HUGEPAGE_CEILING(sz_pind2sz(pind_next));
	size_t block_size = (min_block_size > next_block_size) ? min_block_size
	    : next_block_size;
	base_block_t *block = (base_block_t *)base_map(tsdn, extent_hooks, ind,
	    block_size);
	if (block == NULL) {
		return NULL;
	}

	if (metadata_thp_madvise()) {
		void *addr = (void *)block;
		assert(((uintptr_t)addr & HUGEPAGE_MASK) == 0 &&
		    (block_size & HUGEPAGE_MASK) == 0);
		if (opt_metadata_thp == metadata_thp_always) {
			pages_huge(addr, block_size);
		} else if (opt_metadata_thp == metadata_thp_auto &&
		    base != NULL) {
			/* base != NULL indicates this is not a new base. */
			malloc_mutex_lock(tsdn, &base->mtx);
			base_auto_thp_switch(tsdn, base);
			if (base->auto_thp_switched) {
				pages_huge(addr, block_size);
			}
			malloc_mutex_unlock(tsdn, &base->mtx);
		}
	}

	*pind_last = sz_psz2ind(block_size);
	block->size = block_size;
	block->next = NULL;
	assert(block_size >= header_size);
	base_extent_init(extent_sn_next, &block->extent,
	    (void *)((uintptr_t)block + header_size), block_size - header_size);
	return block;
}